

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lottiemodel.h
# Opt level: O2

int __thiscall rlottie::internal::model::Layer::timeRemap(Layer *this,int frameNo)

{
  Extra *pEVar1;
  Composition *this_00;
  long lVar2;
  int iVar3;
  float fVar4;
  
  pEVar1 = (this->mExtra)._M_t.
           super___uniq_ptr_impl<rlottie::internal::model::Layer::Extra,_std::default_delete<rlottie::internal::model::Layer::Extra>_>
           ._M_t.
           super__Tuple_impl<0UL,_rlottie::internal::model::Layer::Extra_*,_std::default_delete<rlottie::internal::model::Layer::Extra>_>
           .super__Head_base<0UL,_rlottie::internal::model::Layer::Extra_*,_false>._M_head_impl;
  if ((pEVar1 == (Extra *)0x0) || ((pEVar1->mTimeRemap).isValue_ == true)) {
    iVar3 = frameNo - this->mStartFrame;
  }
  else {
    this_00 = pEVar1->mCompRef;
    fVar4 = Property<float,_void>::value(&pEVar1->mTimeRemap,frameNo);
    lVar2 = Composition::frameAtTime(this_00,(double)fVar4);
    iVar3 = (int)lVar2;
  }
  return (int)((float)iVar3 / this->mTimeStreatch);
}

Assistant:

inline int Layer::timeRemap(int frameNo) const
{
    /*
     * only consider startFrame() when there is no timeRemap.
     * when a layer has timeremap bodymovin updates the startFrame()
     * of all child layer so we don't have to take care of it.
     */
    if (!mExtra || mExtra->mTimeRemap.isStatic())
        frameNo = frameNo - startFrame();
    else
        frameNo =
            mExtra->mCompRef->frameAtTime(mExtra->mTimeRemap.value(frameNo));
    /* Apply time streatch if it has any.
     * Time streatch is just a factor by which the animation will speedup or
     * slow down with respect to the overal animation. Time streach factor is
     * already applied to the layers inFrame and outFrame.
     * @TODO need to find out if timestreatch also affects the in and out frame
     * of the child layers or not. */
    return int(frameNo / mTimeStreatch);
}